

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

void __thiscall
Js::InterpreterStackFrame::OP_ResumeFinally
          (InterpreterStackFrame *this,byte *ip,JumpOffset jumpOffset,RegSlot exceptionRegSlot,
          RegSlot offsetRegSlot)

{
  bool bVar1;
  int iVar2;
  void *pointer;
  
  this[0xd4] = (InterpreterStackFrame)((byte)this[0xd4] | 4);
  bVar1 = IsInDebugMode(this);
  if (bVar1) {
    pointer = DebugProcess(this);
  }
  else {
    pointer = Process(this);
  }
  iVar2 = ::Math::PointerCastToIntegral<int>(pointer);
  this[0xd4] = (InterpreterStackFrame)((byte)this[0xd4] & 0xfb);
  if (iVar2 != 0) {
    ByteCodeReader::SetCurrentOffset((ByteCodeReader *)this,iVar2);
    return;
  }
  iVar2 = ::Math::PointerCastToIntegral<int>(*(void **)(this + (ulong)offsetRegSlot * 8 + 0x160));
  ByteCodeReader::SetCurrentOffset((ByteCodeReader *)this,iVar2);
  if (*(JavascriptExceptionObject **)(this + (ulong)exceptionRegSlot * 8 + 0x160) ==
      (JavascriptExceptionObject *)0x0) {
    return;
  }
  JavascriptExceptionOperators::DoThrow
            (*(JavascriptExceptionObject **)(this + (ulong)exceptionRegSlot * 8 + 0x160),
             *(ScriptContext **)(this + 0x78));
}

Assistant:

void InterpreterStackFrame::OP_ResumeFinally(const byte* ip, Js::JumpOffset jumpOffset, RegSlot exceptionRegSlot, RegSlot offsetRegSlot)
    {
        this->OrFlags(InterpreterStackFrameFlags_WithinFinallyBlock);

        int newOffset = 0;
#ifdef ENABLE_SCRIPT_DEBUGGING
        if (this->IsInDebugMode())
        {
            newOffset = ::Math::PointerCastToIntegral<int>(this->DebugProcess());
        }
        else
#endif
        {
            newOffset = ::Math::PointerCastToIntegral<int>(this->Process());
        }

        this->ClearFlags(InterpreterStackFrameFlags_WithinFinallyBlock);

        bool endOfFinallyBlock = newOffset == 0;
        if (endOfFinallyBlock)
        {
            // Finally completed without taking over the flow. Resume where we left off before calling it.
            int currOffset = ::Math::PointerCastToIntegral<int>(GetNonVarReg(offsetRegSlot));
            m_reader.SetCurrentOffset(currOffset);
        }
        else
        {
            // Finally seized the flow with a jump out of its scope. Resume at the jump target and
            // force the runtime to return to this frame without executing the catch.
            m_reader.SetCurrentOffset(newOffset);
            return;
        }

        Js::JavascriptExceptionObject* exceptionObj = (Js::JavascriptExceptionObject*)GetNonVarReg(exceptionRegSlot);
        if (exceptionObj)
        {
            JavascriptExceptionOperators::DoThrow(exceptionObj, scriptContext);
        }
    }